

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  void *pvVar2;
  bool bVar3;
  ostream *poVar4;
  ParsedInput *pPVar5;
  reference pRVar6;
  mapped_type *this;
  size_type sVar7;
  const_reference obj;
  size_type sVar8;
  void *pvVar9;
  RationalNum **matrix;
  RationalNum *pRVar10;
  reference ppVar11;
  reference pvVar12;
  reference obj_00;
  RationalNum **ppRVar13;
  long lVar14;
  ulong uVar15;
  RationalNum *local_3f8;
  RationalNum *local_3c8;
  uint local_2dc;
  uint local_2d8;
  int i_7;
  int j_4;
  int i_6;
  int j_3;
  int i_5;
  int j_2;
  int i_4;
  RationalNum **C1;
  undefined1 local_2b0 [4];
  int j_1;
  vector<RationalNum,_std::allocator<RationalNum>_> basisVector;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
  *__range2_1;
  pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>
  *space_1;
  iterator __end1_3;
  iterator __begin1_3;
  map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
  *__range1_3;
  int i_3;
  RationalNum **C;
  RationalNum **D;
  pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>
  *space;
  iterator __end1_2;
  iterator __begin1_2;
  map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
  *__range1_2;
  int basisVectorsCount;
  int i_2;
  vector<RationalNum,_std::allocator<RationalNum>_> *vector;
  iterator __end2;
  iterator __begin2;
  set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
  *__range2;
  undefined1 local_1e8 [8];
  set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
  basis;
  RationalNum eigenValue_1;
  _Self local_1a0;
  iterator __end1_1;
  iterator __begin1_1;
  set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *__range1_1;
  map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
  eigenSpaces;
  RationalNum eigenValue;
  _Self local_140;
  iterator __end1;
  iterator __begin1;
  set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *__range1;
  undefined1 local_120 [4];
  int m;
  set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> eigenValues;
  RationalNum local_e0;
  RationalNum local_d0;
  RationalNum local_c0;
  RationalNum local_b0;
  RationalNum local_a0;
  RationalNum local_90;
  RationalNum local_80;
  uint local_6c;
  Polynomial *pPStack_68;
  int i_1;
  Polynomial *polynomial;
  uint local_58;
  int j;
  int i;
  allocator local_41;
  string local_40;
  ParsedInput *local_20;
  ParsedInput *input;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  input = (ParsedInput *)argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"You must write filename");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
    pPVar5 = parseInput(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_20 = pPVar5;
    if (pPVar5 == (ParsedInput *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Error while parsing filename");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -1;
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"Matrix:");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      for (local_58 = 0; local_58 < local_20->n; local_58 = local_58 + 1) {
        for (polynomial._4_4_ = 0; polynomial._4_4_ < local_20->n;
            polynomial._4_4_ = polynomial._4_4_ + 1) {
          polynomial._0_4_ = std::setw(3);
          poVar4 = std::operator<<((ostream *)&std::cout,polynomial._0_4_);
          poVar4 = operator<<(poVar4,local_20->matrix[(int)local_58] + (int)polynomial._4_4_);
          std::operator<<(poVar4," ");
        }
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      pPStack_68 = getCharacteristicPolynomial(local_20->matrix,local_20->n);
      poVar4 = std::operator<<((ostream *)&std::cout,"Characteristics polynomial:");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"F(x) = ");
      for (local_6c = pPStack_68->degree; -1 < (int)local_6c; local_6c = local_6c - 1) {
        if ((int)local_6c < 1) {
          if (local_6c == 0) {
            pRVar10 = pPStack_68->coefficients;
            RationalNum::RationalNum(&local_d0,0,1);
            bVar3 = operator>(pRVar10,&local_d0);
            if (bVar3) {
              poVar4 = std::operator<<((ostream *)&std::cout,"+ ");
              operator<<(poVar4,pPStack_68->coefficients + (int)local_6c);
            }
            else {
              pRVar10 = pPStack_68->coefficients;
              lVar14 = (long)(int)local_6c;
              RationalNum::RationalNum(&local_e0,0,1);
              bVar3 = operator<(pRVar10 + lVar14,&local_e0);
              if (bVar3) {
                poVar4 = std::operator<<((ostream *)&std::cout,"- ");
                join_0x00000010_0x00000000_ =
                     RationalNum::operator-(pPStack_68->coefficients + (int)local_6c);
                operator<<(poVar4,(RationalNum *)
                                  &eigenValues._M_t._M_impl.super__Rb_tree_header._M_node_count);
              }
            }
          }
        }
        else {
          pRVar10 = pPStack_68->coefficients;
          lVar14 = (long)(int)local_6c;
          RationalNum::RationalNum(&local_80,1,1);
          bVar3 = operator==(pRVar10 + lVar14,&local_80);
          if (bVar3) {
            poVar4 = std::operator<<((ostream *)&std::cout,"x^");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6c);
            std::operator<<(poVar4," ");
          }
          else {
            pRVar10 = pPStack_68->coefficients;
            lVar14 = (long)(int)local_6c;
            RationalNum::RationalNum(&local_90,-1,1);
            bVar3 = operator==(pRVar10 + lVar14,&local_90);
            if (bVar3) {
              poVar4 = std::operator<<((ostream *)&std::cout,"- x^");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6c);
              std::operator<<(poVar4," ");
            }
            else {
              pRVar10 = pPStack_68->coefficients;
              lVar14 = (long)(int)local_6c;
              RationalNum::RationalNum(&local_a0,0,1);
              bVar3 = operator>(pRVar10 + lVar14,&local_a0);
              if (bVar3) {
                poVar4 = std::operator<<((ostream *)&std::cout,"+ ");
                poVar4 = operator<<(poVar4,pPStack_68->coefficients + (int)local_6c);
                poVar4 = std::operator<<(poVar4," ");
                poVar4 = std::operator<<(poVar4,"x^");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6c);
                std::operator<<(poVar4," ");
              }
              else {
                pRVar10 = pPStack_68->coefficients;
                lVar14 = (long)(int)local_6c;
                RationalNum::RationalNum(&local_b0,0,1);
                bVar3 = operator<(pRVar10 + lVar14,&local_b0);
                if (bVar3) {
                  poVar4 = std::operator<<((ostream *)&std::cout,"- ");
                  local_c0 = RationalNum::operator-(pPStack_68->coefficients + (int)local_6c);
                  poVar4 = operator<<(poVar4,&local_c0);
                  poVar4 = std::operator<<(poVar4," ");
                  poVar4 = std::operator<<(poVar4,"x^");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6c);
                  std::operator<<(poVar4," ");
                }
              }
            }
          }
        }
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Rational eigenvalues: ");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      findRationalSolutions
                ((set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *)local_120
                 ,pPStack_68);
      __range1._4_4_ = 1;
      __end1 = std::set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>::begin
                         ((set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *)
                          local_120);
      local_140._M_node =
           (_Base_ptr)
           std::set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>::end
                     ((set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *)
                      local_120);
      while (bVar3 = std::operator!=(&__end1,&local_140), bVar3) {
        pRVar6 = std::_Rb_tree_const_iterator<RationalNum>::operator*(&__end1);
        eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_node_count = pRVar6->numerator;
        poVar4 = std::operator<<((ostream *)&std::cout,"x_");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,__range1._4_4_);
        poVar4 = std::operator<<(poVar4," = ");
        poVar4 = operator<<(poVar4,(RationalNum *)
                                   &eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::_Rb_tree_const_iterator<RationalNum>::operator++(&__end1);
        __range1._4_4_ = __range1._4_4_ + 1;
      }
      std::
      map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
      ::map((map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
             *)&__range1_1);
      poVar4 = std::operator<<((ostream *)&std::cout,"Eigenspaces: ");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      __end1_1 = std::set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>::begin
                           ((set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>
                             *)local_120);
      local_1a0._M_node =
           (_Base_ptr)
           std::set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>::end
                     ((set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *)
                      local_120);
      while (bVar3 = std::operator!=(&__end1_1,&local_1a0), bVar3) {
        pRVar6 = std::_Rb_tree_const_iterator<RationalNum>::operator*(&__end1_1);
        basis._M_t._M_impl.super__Rb_tree_header._M_node_count = pRVar6->numerator;
        getEigenSpaceBasis((set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                            *)local_1e8,local_20->matrix,local_20->n,*pRVar6);
        this = std::
               map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
               ::operator[]((map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                             *)&__range1_1,
                            (key_type *)&basis._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
        ::operator=(this,(set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                          *)local_1e8);
        poVar4 = std::operator<<((ostream *)&std::cout,"L(");
        poVar4 = operator<<(poVar4,(RationalNum *)
                                   &basis._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::operator<<(poVar4,") = span ( ");
        __end2 = std::
                 set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                 ::begin((set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                          *)local_1e8);
        vector = (vector<RationalNum,_std::allocator<RationalNum>_> *)
                 std::
                 set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                 ::end((set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                        *)local_1e8);
        while (bVar3 = std::operator!=(&__end2,(_Self *)&vector), bVar3) {
          pvVar12 = std::
                    _Rb_tree_const_iterator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>
                    ::operator*(&__end2);
          std::operator<<((ostream *)&std::cout,"(");
          for (__range1_2._4_4_ = 0;
              sVar7 = std::vector<RationalNum,_std::allocator<RationalNum>_>::size(pvVar12),
              (ulong)(long)__range1_2._4_4_ < sVar7; __range1_2._4_4_ = __range1_2._4_4_ + 1) {
            obj = std::vector<RationalNum,_std::allocator<RationalNum>_>::operator[]
                            (pvVar12,(long)__range1_2._4_4_);
            operator<<((ostream *)&std::cout,obj);
            sVar7 = std::vector<RationalNum,_std::allocator<RationalNum>_>::size(pvVar12);
            if ((ulong)(long)__range1_2._4_4_ < sVar7 - 1) {
              std::operator<<((ostream *)&std::cout,", ");
            }
          }
          std::operator<<((ostream *)&std::cout,") ");
          std::_Rb_tree_const_iterator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>::
          operator++(&__end2);
        }
        poVar4 = std::operator<<((ostream *)&std::cout,")");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::
        set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
        ::~set((set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                *)local_1e8);
        std::_Rb_tree_const_iterator<RationalNum>::operator++(&__end1_1);
      }
      __range1_2._0_4_ = 0;
      __end1_2 = std::
                 map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                 ::begin((map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                          *)&__range1_1);
      space = (pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>
               *)std::
                 map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                 ::end((map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                        *)&__range1_1);
      while (bVar3 = std::operator!=(&__end1_2,(_Self *)&space), bVar3) {
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>
                  ::operator*(&__end1_2);
        sVar8 = std::
                set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                ::size(&ppVar11->second);
        __range1_2._0_4_ = (uint)__range1_2 + (int)sVar8;
        std::
        _Rb_tree_iterator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>
        ::operator++(&__end1_2);
      }
      if ((uint)__range1_2 < local_20->n) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "Not enough eigen vectors to make eigen basis");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        pvVar9 = operator_new__((ulong)local_20->n << 3);
        matrix = (RationalNum **)operator_new__((ulong)local_20->n << 3);
        for (__range1_3._4_4_ = 0; __range1_3._4_4_ < local_20->n;
            __range1_3._4_4_ = __range1_3._4_4_ + 1) {
          uVar15 = (ulong)local_20->n;
          pRVar10 = (RationalNum *)operator_new__(uVar15 << 4);
          if (uVar15 != 0) {
            local_3c8 = pRVar10;
            do {
              RationalNum::RationalNum(local_3c8);
              local_3c8 = local_3c8 + 1;
            } while (local_3c8 != pRVar10 + uVar15);
          }
          *(RationalNum **)((long)pvVar9 + (long)(int)__range1_3._4_4_ * 8) = pRVar10;
          uVar15 = (ulong)local_20->n;
          pRVar10 = (RationalNum *)operator_new__(uVar15 << 4);
          if (uVar15 != 0) {
            local_3f8 = pRVar10;
            do {
              RationalNum::RationalNum(local_3f8);
              local_3f8 = local_3f8 + 1;
            } while (local_3f8 != pRVar10 + uVar15);
          }
          matrix[(int)__range1_3._4_4_] = pRVar10;
        }
        __range1._4_4_ = 0;
        __end1_3 = std::
                   map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                   ::begin((map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                            *)&__range1_1);
        space_1 = (pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>
                   *)std::
                     map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                     ::end((map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                            *)&__range1_1);
        while (bVar3 = std::operator!=(&__end1_3,(_Self *)&space_1), bVar3) {
          ppVar11 = std::
                    _Rb_tree_iterator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>
                    ::operator*(&__end1_3);
          __end2_1 = std::
                     set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                     ::begin(&ppVar11->second);
          basisVector.super__Vector_base<RationalNum,_std::allocator<RationalNum>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                        ::end(&ppVar11->second);
          while (bVar3 = std::operator!=(&__end2_1,
                                         (_Self *)&basisVector.
                                                                                                      
                                                  super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                        ), bVar3) {
            pvVar12 = std::
                      _Rb_tree_const_iterator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>
                      ::operator*(&__end2_1);
            std::vector<RationalNum,_std::allocator<RationalNum>_>::vector
                      ((vector<RationalNum,_std::allocator<RationalNum>_> *)local_2b0,pvVar12);
            RationalNum::operator=
                      ((RationalNum *)
                       (*(long *)((long)pvVar9 + (long)__range1._4_4_ * 8) +
                       (long)__range1._4_4_ * 0x10),&ppVar11->first);
            for (C1._4_4_ = 0; C1._4_4_ < local_20->n; C1._4_4_ = C1._4_4_ + 1) {
              obj_00 = std::vector<RationalNum,_std::allocator<RationalNum>_>::operator[]
                                 ((vector<RationalNum,_std::allocator<RationalNum>_> *)local_2b0,
                                  (long)(int)C1._4_4_);
              RationalNum::operator=(matrix[(int)C1._4_4_] + __range1._4_4_,obj_00);
            }
            __range1._4_4_ = __range1._4_4_ + 1;
            std::vector<RationalNum,_std::allocator<RationalNum>_>::~vector
                      ((vector<RationalNum,_std::allocator<RationalNum>_> *)local_2b0);
            std::_Rb_tree_const_iterator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>::
            operator++(&__end2_1);
          }
          std::
          _Rb_tree_iterator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>
          ::operator++(&__end1_3);
        }
        ppRVar13 = getInverseMatrix(matrix,local_20->n);
        poVar4 = std::operator<<((ostream *)&std::cout,"Matrix decomposition: ");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"A = C D C^(-1)");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"C:");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        for (i_5 = 0; (uint)i_5 < local_20->n; i_5 = i_5 + 1) {
          for (j_3 = 0; (uint)j_3 < local_20->n; j_3 = j_3 + 1) {
            poVar4 = operator<<((ostream *)&std::cout,matrix[i_5] + j_3);
            std::operator<<(poVar4," ");
          }
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"D:");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        for (i_6 = 0; (uint)i_6 < local_20->n; i_6 = i_6 + 1) {
          for (j_4 = 0; (uint)j_4 < local_20->n; j_4 = j_4 + 1) {
            poVar4 = operator<<((ostream *)&std::cout,
                                (RationalNum *)
                                (*(long *)((long)pvVar9 + (long)i_6 * 8) + (long)j_4 * 0x10));
            std::operator<<(poVar4," ");
          }
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"C^(-1):");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        for (i_7 = 0; (uint)i_7 < local_20->n; i_7 = i_7 + 1) {
          for (local_2d8 = 0; local_2d8 < local_20->n; local_2d8 = local_2d8 + 1) {
            poVar4 = operator<<((ostream *)&std::cout,ppRVar13[i_7] + (int)local_2d8);
            std::operator<<(poVar4," ");
          }
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        for (local_2dc = 0; local_2dc < local_20->n; local_2dc = local_2dc + 1) {
          if (local_20->matrix[(int)local_2dc] != (RationalNum *)0x0) {
            operator_delete__(local_20->matrix[(int)local_2dc]);
          }
          pvVar2 = *(void **)((long)pvVar9 + (long)(int)local_2dc * 8);
          if (pvVar2 != (void *)0x0) {
            operator_delete__(pvVar2);
          }
          if (matrix[(int)local_2dc] != (RationalNum *)0x0) {
            operator_delete__(matrix[(int)local_2dc]);
          }
          if (ppRVar13[(int)local_2dc] != (RationalNum *)0x0) {
            operator_delete__(ppRVar13[(int)local_2dc]);
          }
        }
        if (local_20->matrix != (RationalNum **)0x0) {
          operator_delete__(local_20->matrix);
        }
        if (pvVar9 != (void *)0x0) {
          operator_delete__(pvVar9);
        }
        if (matrix != (RationalNum **)0x0) {
          operator_delete__(matrix);
        }
        if (ppRVar13 != (RationalNum **)0x0) {
          operator_delete__(ppRVar13);
        }
      }
      argv_local._4_4_ = 0;
      std::
      map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
      ::~map((map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
              *)&__range1_1);
      std::set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>::~set
                ((set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *)local_120
                );
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 2) {
        cout << "You must write filename" << endl;
        return -1;
    }

    ParsedInput *input = parseInput(argv[1]);

    if (input == nullptr) {
        cout << "Error while parsing filename" << endl;
        return -1;
    }

    cout << "Matrix:" << endl;
    for (int i = 0; i < input->n; i++) {
        for (int j = 0; j < input->n; j++) {
            cout  << setw(3) << input->matrix[i][j] << " ";
        }
        cout << endl;
    }

    Polynomial *polynomial = getCharacteristicPolynomial(input->matrix, input->n);

    cout << "Characteristics polynomial:" << endl;
    cout << "F(x) = ";
    for (int i = polynomial->degree; i >= 0; i--) {
        if(i > 0) {
            if(polynomial->coefficients[i] == 1ll) {
                cout << "x^" << i << " ";
            }
            else if(polynomial->coefficients[i] == -1ll) {
                cout << "- x^" << i << " ";
            }
            else {
                if(polynomial->coefficients[i] > 0ll) cout << "+ " << polynomial->coefficients[i] << " " << "x^" << i << " ";
                else if(polynomial->coefficients[i] < 0ll) cout << "- " << -polynomial->coefficients[i] << " " << "x^" << i << " ";
            }
        }
        else if(i == 0) {
            if(polynomial->coefficients[i] > 0ll) cout << "+ " << polynomial->coefficients[i];
            else if(polynomial->coefficients[i] < 0ll) cout << "- " << -polynomial->coefficients[i];
        }
    }
    cout << endl;

    cout << "Rational eigenvalues: " << endl;
    set<RationalNum> eigenValues = findRationalSolutions(polynomial);

    int m = 1;
    for(auto eigenValue : eigenValues) {
        cout << "x_" << m++ << " = " << eigenValue << endl;
    }

    map<RationalNum, set<vector<RationalNum>>> eigenSpaces;
    cout << "Eigenspaces: " << endl;
    for(auto eigenValue : eigenValues) {
        set<vector<RationalNum>> basis = getEigenSpaceBasis(input->matrix, input->n, eigenValue);
        eigenSpaces[eigenValue] = basis;
        cout << "L(" << eigenValue << ") = span ( ";
        for(const auto& vector : basis) {
            cout << "(";
            for(int i = 0; i < vector.size(); i++) {
                cout << vector[i];
                if(i < vector.size() - 1) cout << ", ";
            }
            cout << ") ";
        }
        cout << ")" << endl;
    }

    int basisVectorsCount = 0;
    for(const auto& space : eigenSpaces) basisVectorsCount += space.second.size();

    if(basisVectorsCount < input->n) {
        cout << "Not enough eigen vectors to make eigen basis" << endl;
        return 0;
    }

    RationalNum** D = new RationalNum* [input->n];
    RationalNum** C = new RationalNum* [input->n];
    for(int i = 0; i < input->n; i++) {
        D[i] = new RationalNum [input->n];
        C[i] = new RationalNum [input->n];
    }

    m = 0;
    for(const auto& space : eigenSpaces) {
        for(auto basisVector : space.second) {
            D[m][m] = space.first;
            for (int j = 0; j < input->n; j++) C[j][m] = basisVector[j];
            m++;
        }
    }

    RationalNum** C1 = getInverseMatrix(C, input->n);

    cout << "Matrix decomposition: " << endl;
    cout << "A = C D C^(-1)" << endl;
    cout << "C:" << endl;
    for(int i = 0; i < input->n; i++) {
        for(int j = 0; j < input->n; j++) cout << C[i][j] << " ";
        cout << endl;
    }
    cout << "D:" << endl;
    for(int i = 0; i < input->n; i++) {
        for(int j = 0; j < input->n; j++) cout << D[i][j] << " ";
        cout << endl;
    }
    cout << "C^(-1):" << endl;
    for(int i = 0; i < input->n; i++) {
        for(int j = 0; j < input->n; j++) cout << C1[i][j] << " ";
        cout << endl;
    }

    //Освобождение памяти
    for(int i =0 ; i < input->n; i++) {
        delete [] input->matrix[i];
        delete [] D[i];
        delete [] C[i];
        delete [] C1[i];
    }
    delete[] input->matrix;
    delete [] D;
    delete [] C;
    delete [] C1;

    return 0;
}